

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,CastInst *cast,bool decl)

{
  CastOps CVar1;
  undefined7 in_register_00000011;
  uint64_t local_40;
  Type *local_38;
  Value *local_30;
  char *local_28;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_40 = Value::get_tween_id((Value *)cast);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c4942,&local_40);
  }
  else {
    local_40 = Value::get_tween_id((Value *)cast);
    CVar1 = CastInst::getOpcode(cast);
    if (CVar1 - Trunc < 0xd) {
      local_28 = &DAT_001c4760 + *(int *)(&DAT_001c4760 + (ulong)(CVar1 - Trunc) * 4);
    }
    else {
      local_28 = "???";
    }
    local_30 = Instruction::getOperand(&cast->super_Instruction,0);
    local_38 = Value::getType((Value *)cast);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"%",1);
    append<unsigned_long,char_const(&)[4],char_const*,char_const(&)[2],LLVMBC::Value*,char_const(&)[5],LLVMBC::Type*>
              (this,&local_40,(char (*) [4])" = ",&local_28,(char (*) [2])0x1c47f6,&local_30,
               (char (*) [5])" to ",&local_38);
  }
  return;
}

Assistant:

void StreamState::append(CastInst *cast, bool decl)
{
	if (decl)
	{
		append("%", cast->get_tween_id(), " = ", to_string(cast->getOpcode()), " ", cast->getOperand(0), " to ",
		       cast->getType());
	}
	else
	{
		append("%", cast->get_tween_id());
	}
}